

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmx-impl.inc.c
# Opt level: O0

void gen_vspltisw_vinsertw(DisasContext_conflict10 *ctx)

{
  uint32_t uVar1;
  DisasContext_conflict10 *ctx_local;
  
  uVar1 = Rc(ctx->opcode);
  if ((uVar1 == 0) && ((ctx->insns_flags & 0x1000000) != 0)) {
    gen_vspltisw(ctx);
  }
  else {
    uVar1 = Rc(ctx->opcode);
    if ((uVar1 == 1) && ((ctx->insns_flags2 & 0x80000) != 0)) {
      gen_vinsertw(ctx);
    }
    else {
      gen_inval_exception(ctx,1);
    }
  }
  return;
}

Assistant:

static void gen_vsldoi(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_ptr ra, rb, rd;
    TCGv_i32 sh;
    if (unlikely(!ctx->altivec_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VPU);
        return;
    }
    ra = gen_avr_ptr(tcg_ctx, rA(ctx->opcode));
    rb = gen_avr_ptr(tcg_ctx, rB(ctx->opcode));
    rd = gen_avr_ptr(tcg_ctx, rD(ctx->opcode));
    sh = tcg_const_i32(tcg_ctx, VSH(ctx->opcode));
    gen_helper_vsldoi(tcg_ctx, rd, ra, rb, sh);
    tcg_temp_free_ptr(tcg_ctx, ra);
    tcg_temp_free_ptr(tcg_ctx, rb);
    tcg_temp_free_ptr(tcg_ctx, rd);
    tcg_temp_free_i32(tcg_ctx, sh);
}